

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  bool bVar2;
  opj_stream_private_t *poVar3;
  OPJ_BOOL OVar4;
  OPJ_SIZE_T OVar5;
  opj_j2k_t *p_j2k_00;
  OPJ_UINT32 OVar6;
  ulong uVar7;
  ulong uVar8;
  opj_event_mgr_t *poVar9;
  OPJ_BYTE *pOVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  uint p_value;
  int iVar13;
  OPJ_UINT32 l_current_nb_bytes_written_1;
  OPJ_UINT32 l_current_nb_bytes_written;
  OPJ_UINT32 local_94;
  opj_j2k_t *local_90;
  OPJ_BYTE *local_88;
  OPJ_UINT32 local_7c;
  opj_event_mgr_t *local_78;
  opj_tcd *local_70;
  OPJ_UINT32 local_68;
  OPJ_UINT32 local_64;
  opj_stream_private_t *local_60;
  OPJ_UINT32 *local_58;
  opj_tcp_t *local_50;
  opj_tcd *local_48;
  ulong local_40;
  opj_cp_t *local_38;
  
  pOVar10 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
  if (pOVar10 == (OPJ_BYTE *)0x0) {
    __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x3133,
                  "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar6 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
  local_70 = p_j2k->m_tcd;
  local_70->cur_pino = 0;
  (p_j2k->m_specific_param).m_decoder.m_state = 0;
  local_7c = 0;
  local_78 = p_manager;
  OVar4 = opj_j2k_write_sot(p_j2k,pOVar10,OVar6,&local_7c,p_stream,p_manager);
  OVar12 = local_7c;
  bVar2 = true;
  local_90 = p_j2k;
  local_88 = pOVar10;
  local_60 = p_stream;
  if (OVar4 == 0) {
    local_40 = 0;
  }
  else {
    pOVar10 = pOVar10 + local_7c;
    OVar11 = OVar6 - local_7c;
    if ((3 < (ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U)) &&
       (((p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].field_0x1638 & 4) != 0)) {
      local_7c = 0;
      opj_j2k_write_poc_in_memory(p_j2k,pOVar10,&local_7c,local_78);
      pOVar10 = pOVar10 + local_7c;
      OVar11 = OVar11 - local_7c;
      OVar12 = OVar12 + local_7c;
    }
    local_7c = 0;
    OVar4 = opj_j2k_write_sod(local_90,local_70,pOVar10,&local_7c,OVar11,local_60,local_78);
    local_40 = 0;
    if (OVar4 != 0) {
      p_value = OVar12 + local_7c;
      opj_write_bytes_LE(local_88 + 6,p_value,4);
      if ((local_90->m_specific_param).m_encoder.m_TLM != 0) {
        opj_j2k_update_tlm(local_90,p_value);
      }
      bVar2 = false;
      local_40 = (ulong)p_value;
    }
  }
  p_j2k_00 = local_90;
  OVar4 = 0;
  if (!bVar2) {
    pOVar10 = local_88 + local_40;
    OVar6 = OVar6 - (int)local_40;
    local_48 = local_90->m_tcd;
    local_38 = &local_90->m_cp;
    local_50 = (local_90->m_cp).tcps;
    local_58 = (OPJ_UINT32 *)(ulong)local_90->m_current_tile_number;
    iVar13 = 0;
    local_68 = opj_j2k_get_num_tp(local_38,0,local_90->m_current_tile_number);
    pOVar1 = &(p_j2k_00->m_specific_param).m_encoder.m_current_tile_part_number;
    *pOVar1 = *pOVar1 + 1;
    if (1 < local_68) {
      OVar12 = 1;
      iVar13 = 0;
LAB_0011bb60:
      poVar3 = local_60;
      (p_j2k_00->m_specific_param).m_decoder.m_state = OVar12;
      local_94 = 0;
      local_64 = OVar12;
      OVar4 = opj_j2k_write_sot(p_j2k_00,pOVar10,OVar6,&local_94,local_60,local_78);
      OVar12 = local_94;
      bVar2 = true;
      if (OVar4 == 0) {
        local_88._0_4_ = 0;
        p_j2k_00 = local_90;
        poVar9 = local_78;
      }
      else {
        local_88 = (OPJ_BYTE *)CONCAT44(local_88._4_4_,iVar13);
        uVar8 = (ulong)local_94;
        OVar6 = OVar6 - local_94;
        local_94 = 0;
        OVar4 = opj_j2k_write_sod(local_90,local_48,pOVar10 + uVar8,&local_94,OVar6,poVar3,local_78)
        ;
        OVar11 = local_94;
        if (OVar4 != 0) goto code_r0x0011bbd9;
        p_j2k_00 = local_90;
LAB_0011be19:
        local_88._0_4_ = 0;
        bVar2 = true;
        poVar9 = local_78;
      }
      goto LAB_0011be20;
    }
LAB_0011bc57:
    poVar9 = local_78;
    local_88._0_4_ = iVar13;
    if (local_50[(long)local_58].numpocs == 0) {
      bVar2 = false;
    }
    else {
      local_58 = &local_50[(long)local_58].numpocs;
      OVar12 = 1;
      do {
        local_48->cur_pino = OVar12;
        local_50 = (opj_tcp_t *)CONCAT44(local_50._4_4_,OVar12);
        local_68 = opj_j2k_get_num_tp(local_38,OVar12,p_j2k_00->m_current_tile_number);
        p_j2k_00 = local_90;
        if (local_68 != 0) {
          OVar12 = 0;
          do {
            poVar3 = local_60;
            (p_j2k_00->m_specific_param).m_decoder.m_state = OVar12;
            local_94 = 0;
            local_64 = OVar12;
            OVar4 = opj_j2k_write_sot(p_j2k_00,pOVar10,OVar6,&local_94,local_60,poVar9);
            OVar12 = local_94;
            bVar2 = true;
            if (OVar4 == 0) {
              local_88._0_4_ = 0;
              goto LAB_0011be20;
            }
            uVar8 = (ulong)local_94;
            OVar6 = OVar6 - local_94;
            local_94 = 0;
            local_70 = (opj_tcd *)CONCAT44(local_70._4_4_,OVar6);
            OVar4 = opj_j2k_write_sod(p_j2k_00,local_48,pOVar10 + uVar8,&local_94,OVar6,poVar3,
                                      poVar9);
            OVar6 = local_94;
            if (OVar4 == 0) goto LAB_0011be19;
            uVar7 = (ulong)local_94;
            OVar11 = local_94 + OVar12;
            opj_write_bytes_LE(pOVar10 + 6,OVar11,4);
            if ((p_j2k_00->m_specific_param).m_encoder.m_TLM != 0) {
              opj_j2k_update_tlm(local_90,OVar11);
              p_j2k_00 = local_90;
            }
            local_88._0_4_ = (int)local_88 + OVar12 + OVar6;
            pOVar10 = pOVar10 + uVar8 + uVar7;
            pOVar1 = &(p_j2k_00->m_specific_param).m_encoder.m_current_tile_part_number;
            *pOVar1 = *pOVar1 + 1;
            OVar6 = (int)local_70 - OVar6;
            OVar12 = local_64 + 1;
            poVar9 = local_78;
          } while (local_68 != OVar12);
        }
        OVar12 = (int)local_50 + 1;
        bVar2 = false;
      } while (OVar12 <= *local_58);
    }
LAB_0011be20:
    OVar4 = 0;
    if ((!bVar2) &&
       (uVar8 = (ulong)(uint)((int)local_40 + (int)local_88),
       OVar5 = opj_stream_write_data
                         (local_60,(p_j2k_00->m_specific_param).m_encoder.m_encoded_tile_data,uVar8,
                          poVar9), OVar5 == uVar8)) {
      local_90->m_current_tile_number = local_90->m_current_tile_number + 1;
      OVar4 = 1;
    }
  }
  return OVar4;
code_r0x0011bbd9:
  local_70 = (opj_tcd *)CONCAT44(local_70._4_4_,OVar6);
  uVar7 = (ulong)local_94;
  OVar6 = OVar12 + local_94;
  opj_write_bytes_LE(pOVar10 + 6,OVar6,4);
  if ((local_90->m_specific_param).m_encoder.m_TLM != 0) {
    opj_j2k_update_tlm(local_90,OVar6);
  }
  pOVar10 = pOVar10 + uVar8 + uVar7;
  iVar13 = (int)local_88 + OVar12 + OVar11;
  pOVar1 = &(local_90->m_specific_param).m_encoder.m_current_tile_part_number;
  *pOVar1 = *pOVar1 + 1;
  OVar6 = (int)local_70 - OVar11;
  OVar12 = local_64 + 1;
  p_j2k_00 = local_90;
  if (local_68 == OVar12) goto LAB_0011bc57;
  goto LAB_0011bb60;
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}